

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::runCloningDestinationFilters
          (FilterFederate *this,FilterCoordinator *fcoord,BasicHandleInfo *handle,
          ActionMessage *command)

{
  undefined8 this_00;
  bool bVar1;
  __type _Var2;
  reference ppFVar3;
  undefined4 *in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  ActionMessage clone;
  ActionMessage cmd_1;
  ActionMessage cmd;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *msg;
  iterator __end5;
  iterator __begin5;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *__range5;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  FilterInfo *FiltI;
  FilterInfo *clFilter;
  const_iterator __end1;
  const_iterator __begin1;
  vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *__range1;
  ActionMessage *in_stack_fffffffffffffcd8;
  ActionMessage *in_stack_fffffffffffffce0;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *in_stack_fffffffffffffcf0;
  FilterFederate *in_stack_fffffffffffffcf8;
  ActionMessage *in_stack_fffffffffffffd00;
  GlobalFederateId local_2e4 [5];
  BaseType local_2d0;
  BaseType local_2cc;
  ActionMessage *in_stack_fffffffffffffd68;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_fffffffffffffe08;
  ActionMessage *in_stack_fffffffffffffe10;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_168;
  undefined4 local_150;
  undefined4 local_14c;
  reference local_a8;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *local_a0;
  __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
  local_98;
  undefined1 *local_90;
  undefined1 local_78 [72];
  __normal_iterator<helics::FilterInfo_*const_*,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
  local_30;
  long local_28;
  undefined4 *local_18;
  
  *(undefined1 *)((long)in_RDI + 0x285) = 1;
  local_28 = in_RSI + 0x38;
  local_18 = in_RDX;
  local_30._M_current =
       (FilterInfo **)
       std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::begin
                 ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                  in_stack_fffffffffffffcd8);
  local_78._64_8_ =
       std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::end
                 ((vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_> *)
                  in_stack_fffffffffffffcd8);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::FilterInfo_*const_*,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                           ((__normal_iterator<helics::FilterInfo_*const_*,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                             *)in_stack_fffffffffffffce0,
                            (__normal_iterator<helics::FilterInfo_*const_*,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
                             *)in_stack_fffffffffffffcd8), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppFVar3 = __gnu_cxx::
              __normal_iterator<helics::FilterInfo_*const_*,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
              ::operator*(&local_30);
    local_78._56_8_ = *ppFVar3;
    bVar1 = checkActionFlag<helics::FilterInfo,helics::ConnectionFlags>
                      ((FilterInfo *)local_78._56_8_,disconnected_flag);
    this_00 = local_78._56_8_;
    if (!bVar1) {
      local_78._52_4_ =
           GlobalFederateId::operator_cast_to_GlobalBrokerId
                     ((GlobalFederateId *)in_stack_fffffffffffffcd8);
      bVar1 = GlobalBrokerId::operator==((GlobalBrokerId *)this_00,(GlobalBrokerId)local_78._52_4_);
      if (bVar1) {
        local_78._36_4_ = *in_RDI;
        local_78._32_4_ = ((InterfaceHandle *)(local_78._56_8_ + 4))->hid;
        local_78._40_8_ =
             getFilterInfo(in_stack_fffffffffffffcf8,
                           (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd00 >> 0x20),
                           (InterfaceHandle)(BaseType)in_stack_fffffffffffffd00);
        if (((FilterInfo *)local_78._40_8_ != (FilterInfo *)0x0) &&
           (bVar1 = std::operator==((shared_ptr<helics::FilterOperator> *)in_stack_fffffffffffffce0,
                                    in_stack_fffffffffffffcd8), ((bVar1 ^ 0xffU) & 1) != 0)) {
          in_stack_fffffffffffffcf8 =
               (FilterFederate *)
               std::
               __shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x654d67);
          in_stack_fffffffffffffd00 = (ActionMessage *)local_78;
          createMessageFromCommand(in_stack_fffffffffffffd68);
          (*(*(_func_int ***)in_stack_fffffffffffffcf8)[3])
                    (local_78 + 8,in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00);
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffffcf0);
          local_90 = local_78 + 8;
          local_98._M_current =
               (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               std::
               vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               ::begin((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                        *)in_stack_fffffffffffffcd8);
          local_a0 = (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     std::
                     vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                     ::end((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                            *)in_stack_fffffffffffffcd8);
          while (bVar1 = __gnu_cxx::
                         operator==<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                   ((__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                     *)in_stack_fffffffffffffce0,
                                    (__normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                                     *)in_stack_fffffffffffffcd8), ((bVar1 ^ 0xffU) & 1) != 0) {
            local_a8 = __gnu_cxx::
                       __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
                       ::operator*(&local_98);
            bVar1 = std::unique_ptr::operator_cast_to_bool
                              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *
                               )0x654e2c);
            if (bVar1) {
              std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         0x654e42);
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffd00,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)in_stack_fffffffffffffcf8);
              if (_Var2) {
                in_stack_fffffffffffffcf0 = &local_168;
                std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                          ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           in_stack_fffffffffffffce0,
                           (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           in_stack_fffffffffffffcd8);
                ActionMessage::ActionMessage(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
                std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                          ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           in_stack_fffffffffffffcf0);
                local_150 = *local_18;
                local_14c = local_18[1];
                std::function<void_(helics::ActionMessage_&&)>::operator()
                          ((function<void_(helics::ActionMessage_&&)> *)in_stack_fffffffffffffce0,
                           in_stack_fffffffffffffcd8);
                ActionMessage::~ActionMessage(in_stack_fffffffffffffce0);
              }
              else {
                std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                          ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           in_stack_fffffffffffffce0,
                           (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           in_stack_fffffffffffffcd8);
                ActionMessage::ActionMessage(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
                std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                          ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                           in_stack_fffffffffffffcf0);
                std::function<void_(helics::ActionMessage_&)>::operator()
                          ((function<void_(helics::ActionMessage_&)> *)in_stack_fffffffffffffce0,
                           in_stack_fffffffffffffcd8);
                ActionMessage::~ActionMessage(in_stack_fffffffffffffce0);
              }
            }
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_*,_std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_>
            ::operator++(&local_98);
          }
          std::
          vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ::~vector(in_stack_fffffffffffffcf0);
        }
      }
      else {
        in_stack_fffffffffffffce0 = (ActionMessage *)(local_2e4 + 1);
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffffd00,(ActionMessage *)in_stack_fffffffffffffcf8);
        ActionMessage::setAction(in_stack_fffffffffffffce0,cmd_send_for_filter);
        GlobalFederateId::GlobalFederateId(local_2e4,(GlobalBrokerId)*(BaseType *)local_78._56_8_);
        local_2d0 = local_2e4[0].gid;
        local_2cc = ((InterfaceHandle *)(local_78._56_8_ + 4))->hid;
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffce0,
                   in_stack_fffffffffffffcd8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffce0);
      }
    }
    __gnu_cxx::
    __normal_iterator<helics::FilterInfo_*const_*,_std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void FilterFederate::runCloningDestinationFilters(const FilterCoordinator* fcoord,
                                                  const BasicHandleInfo* handle,
                                                  const ActionMessage& command) const
{
    mCoord.triggered = true;
    // now go to the cloning filters
    for (auto* clFilter : fcoord->cloningDestFilters) {
        if (checkActionFlag(*clFilter, disconnected_flag)) {
            continue;
        }
        if (clFilter->core_id == mFedID) {
            const auto* FiltI = getFilterInfo(mFedID, clFilter->handle);
            if (FiltI != nullptr) {
                if (FiltI->filterOp != nullptr) {
                    // this is a cloning filter so it generates a bunch(?) of new
                    // messages
                    auto new_messages =
                        FiltI->filterOp->processVector(createMessageFromCommand(command));
                    for (auto& msg : new_messages) {
                        if (msg) {
                            if (msg->dest == handle->key) {
                                // in case the clone filter send to itself.
                                ActionMessage cmd(std::move(msg));
                                cmd.dest_id = handle->handle.fed_id;
                                cmd.dest_handle = handle->handle.handle;
                                mSendMessageMove(std::move(cmd));
                            } else {
                                ActionMessage cmd(std::move(msg));
                                mDeliverMessage(cmd);
                            }
                        }
                    }
                }
            }
        } else {
            ActionMessage clone(command);
            clone.setAction(CMD_SEND_FOR_FILTER);
            clone.dest_id = clFilter->core_id;
            clone.dest_handle = clFilter->handle;
            mSendMessage(clone);
        }
    }
}